

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlThrDefLineNumbersDefaultValue(void)

{
  int iVar1;
  int iVar2;
  int val;
  int local_1c;
  int n_v;
  int v;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    iVar2 = gen_int(local_1c,0);
    val = xmlThrDefLineNumbersDefaultValue(iVar2);
    desret_int(val);
    call_tests = call_tests + 1;
    des_int(local_1c,iVar2,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefLineNumbersDefaultValue",
             (ulong)(uint)(iVar2 - iVar1));
      ret_val = ret_val + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlThrDefLineNumbersDefaultValue(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    int v; /*  */
    int n_v;

    for (n_v = 0;n_v < gen_nb_int;n_v++) {
        mem_base = xmlMemBlocks();
        v = gen_int(n_v, 0);

        ret_val = xmlThrDefLineNumbersDefaultValue(v);
        desret_int(ret_val);
        call_tests++;
        des_int(n_v, v, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlThrDefLineNumbersDefaultValue",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_v);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}